

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

bool __thiscall bench::push_back_solver(bench *this,string_view name)

{
  char *in_RCX;
  string_view name_00;
  optional<bench::solver> slv;
  _Optional_payload_base<bench::solver> _Stack_38;
  
  name_00._M_len = name._M_str;
  name_00._M_str = in_RCX;
  solver::make_solver((optional<bench::solver> *)&_Stack_38,(solver *)name._M_len,name_00);
  if (_Stack_38._M_engaged == true) {
    std::vector<bench::solver,std::allocator<bench::solver>>::emplace_back<bench::solver&>
              ((vector<bench::solver,std::allocator<bench::solver>> *)&this->solvers,
               (solver *)&_Stack_38);
  }
  std::_Optional_payload_base<bench::solver>::_M_reset(&_Stack_38);
  return _Stack_38._M_engaged;
}

Assistant:

bool push_back_solver(std::string_view name)
    {
        auto slv = solver::make_solver(name);
        if (!slv)
            return false;

        solvers.emplace_back(*slv);

        return true;
    }